

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O2

void enable_interrupt(ixgbe_device *dev,uint16_t queue_id)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  int8_t in_CL;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  int8_t direction;
  char *__format;
  char *pcVar6;
  
  if ((dev->ixy).interrupts.interrupts_enabled != true) {
    return;
  }
  uVar1 = (dev->ixy).interrupts.interrupt_type;
  direction = (int8_t)queue_id;
  if (uVar1 == '\x01') {
    set_ivar(dev,direction,'\0',in_CL);
    puVar2 = dev->addr;
    __format = "[DEBUG] %s:%d %s(): Using MSI interrupts\n";
    pcVar6 = "enable_msi_interrupt";
    lVar5 = 0x122a0;
    if (queue_id < 0x18) {
      lVar5 = 0x820;
    }
    puVar2[0x810] = '\0';
    puVar2[0x811] = '\0';
    puVar2[0x812] = '\0';
    puVar2[0x813] = '\0';
    *(uint32_t *)(dev->addr + lVar5 + (ulong)queue_id * 4) = (dev->ixy).interrupts.itr_rate;
    puVar2 = dev->addr;
    puVar2[0x888] = 0xff;
    puVar2[0x889] = 0xff;
    puVar2[0x88a] = 0xff;
    puVar2[0x88b] = 0xff;
    *(uint *)(dev->addr + 0x880) = *(uint *)(dev->addr + 0x880) | 1 << (queue_id & 0x1f);
    uVar4 = 0x96;
  }
  else {
    if (uVar1 != '\x02') {
      fprintf(_stderr,"[WARN ] %s:%d %s(): Interrupt type not supported: %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0xdd,"enable_interrupt");
      return;
    }
    uVar3 = *(uint *)(dev->addr + 0x898) | 0xc0000010;
    *(uint *)(dev->addr + 0x898) = uVar3;
    set_ivar(dev,direction,direction,(int8_t)uVar3);
    puVar2 = dev->addr;
    __format = "[DEBUG] %s:%d %s(): Using MSIX interrupts\n";
    pcVar6 = "enable_msix_interrupt";
    lVar5 = 0x122a0;
    if (queue_id < 0x18) {
      lVar5 = 0x820;
    }
    puVar2[0x810] = 0xff;
    puVar2[0x811] = 0xff;
    puVar2[0x812] = '\0';
    puVar2[0x813] = '\0';
    *(uint32_t *)(dev->addr + lVar5 + (ulong)queue_id * 4) = (dev->ixy).interrupts.itr_rate;
    *(uint *)(dev->addr + 0x880) = *(uint *)(dev->addr + 0x880) | 1 << (queue_id & 0x1f);
    uVar4 = 0xc9;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          uVar4,pcVar6);
  return;
}

Assistant:

static void enable_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	if (!dev->ixy.interrupts.interrupts_enabled) {
		return;
	}
	switch (dev->ixy.interrupts.interrupt_type) {
		case VFIO_PCI_MSIX_IRQ_INDEX:
			enable_msix_interrupt(dev, queue_id);
			break;
		case VFIO_PCI_MSI_IRQ_INDEX:
			enable_msi_interrupt(dev, queue_id);
			break;
		default:
			warn("Interrupt type not supported: %d", dev->ixy.interrupts.interrupt_type);
			return;
	}
}